

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

void __thiscall duckdb::ColumnData::ClearUpdates(ColumnData *this)

{
  pointer in_RDI;
  lock_guard<std::mutex> update_guard;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  ::std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,(mutex_type *)in_RDI);
  unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::reset
            ((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true> *)
             in_stack_fffffffffffffff0,in_RDI);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xb8d1c1);
  return;
}

Assistant:

void ColumnData::ClearUpdates() {
	lock_guard<mutex> update_guard(update_lock);
	updates.reset();
}